

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O3

void helicsMessageSetData(HelicsMessage message,void *data,int inputDataLength,HelicsError *err)

{
  size_t size;
  
  if (err == (HelicsError *)0x0) {
    if (message == (HelicsMessage)0x0) {
      return;
    }
    if (*(short *)((long)message + 10) != 0xb3) {
      return;
    }
  }
  else {
    if (err->error_code != 0) {
      return;
    }
    if ((message == (HelicsMessage)0x0) || (*(short *)((long)message + 10) != 0xb3)) {
      err->error_code = -4;
      err->message = "The message object was not valid";
      return;
    }
  }
  size = (size_t)inputDataLength;
  if (*(void **)((long)message + 0x60) == data) {
    *(size_t *)((long)message + 0x50) = size;
  }
  else {
    helics::SmallBuffer::reserve((SmallBuffer *)((long)message + 0x10),size);
    *(size_t *)((long)message + 0x50) = size;
    if (inputDataLength != 0) {
      memcpy(*(void **)((long)message + 0x60),data,size);
      return;
    }
  }
  return;
}

Assistant:

void helicsMessageSetData(HelicsMessage message, const void* data, int inputDataLength, HelicsError* err)
{
    auto* mess = getMessageObj(message, err);
    if (mess == nullptr) {
        return;
    }
    mess->data = std::string_view(static_cast<const char*>(data), inputDataLength);
}